

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stresstest.c
# Opt level: O1

int run_tests(int64_t *sizes,int sizes_cnt,int type)

{
  uint size;
  ulong uVar1;
  int iVar2;
  EVP_PKEY_CTX *ctx;
  char **tbs;
  uchar *tbs_00;
  code *tbs_01;
  size_t siglen;
  size_t siglen_00;
  size_t siglen_01;
  size_t siglen_02;
  size_t siglen_03;
  size_t siglen_04;
  size_t siglen_05;
  size_t siglen_06;
  size_t siglen_07;
  size_t siglen_08;
  size_t siglen_09;
  size_t siglen_10;
  size_t siglen_11;
  size_t siglen_12;
  char *pcVar3;
  size_t in_R8;
  long lVar4;
  long lVar5;
  bool bVar6;
  timeval t;
  double local_78;
  timeval local_70;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  ulong local_40;
  int64_t *local_38;
  
  local_38 = sizes;
  ctx = (EVP_PKEY_CTX *)malloc(0x52080);
  tbs = test_names;
  printf("-------\nRunning tests with %s:\n",test_names[type]);
  printf("%-29s","extra.h yysort1_int64");
  if (sizes_cnt < 1) {
    printf(" - %s, %10.1f usec\n",0,"FAILED");
    fflush((FILE *)0x0);
  }
  else {
    local_40 = (ulong)(uint)sizes_cnt;
    lVar5 = local_40 - 1;
    local_78 = 0.0;
    lVar4 = 0;
    do {
      uVar1 = local_38[lVar4];
      fill((int64_t *)ctx,(int)uVar1,type);
      gettimeofday(&local_70,(__timezone_ptr_t)0x0);
      local_48 = (double)local_70.tv_sec;
      local_50 = (double)local_70.tv_usec;
      yysort1_int64((int64_t *)ctx,uVar1);
      gettimeofday(&local_70,(__timezone_ptr_t)0x0);
      local_58 = (double)local_70.tv_sec;
      local_60 = (double)local_70.tv_usec;
      iVar2 = verify(ctx,(uchar *)(uVar1 & 0xffffffff),siglen,(uchar *)tbs,in_R8);
      if (iVar2 == 0) break;
      local_78 = local_78 + ((local_58 * 1000000.0 + local_60) - (local_48 * 1000000.0 + local_50));
      bVar6 = lVar5 != lVar4;
      lVar4 = lVar4 + 1;
    } while (bVar6);
    pcVar3 = "ok";
    if (iVar2 == 0) {
      pcVar3 = "FAILED";
    }
    printf(" - %s, %10.1f usec\n",local_78,pcVar3);
    fflush((FILE *)0x0);
    if (iVar2 != 0) {
      printf("%-29s","extra.h yysort2_int64");
      lVar5 = local_40 - 1;
      local_78 = 0.0;
      lVar4 = 0;
      do {
        uVar1 = local_38[lVar4];
        fill((int64_t *)ctx,(int)uVar1,type);
        gettimeofday(&local_70,(__timezone_ptr_t)0x0);
        local_48 = (double)local_70.tv_sec;
        local_50 = (double)local_70.tv_usec;
        yysort2_int64((int64_t *)ctx,uVar1);
        gettimeofday(&local_70,(__timezone_ptr_t)0x0);
        local_58 = (double)local_70.tv_sec;
        local_60 = (double)local_70.tv_usec;
        iVar2 = verify(ctx,(uchar *)(uVar1 & 0xffffffff),siglen_00,(uchar *)tbs,in_R8);
        if (iVar2 == 0) break;
        local_78 = local_78 +
                   ((local_58 * 1000000.0 + local_60) - (local_48 * 1000000.0 + local_50));
        bVar6 = lVar5 != lVar4;
        lVar4 = lVar4 + 1;
      } while (bVar6);
      pcVar3 = "ok";
      if (iVar2 == 0) {
        pcVar3 = "FAILED";
      }
      printf(" - %s, %10.1f usec\n",local_78,pcVar3);
      fflush((FILE *)0x0);
      if (iVar2 != 0) {
        printf("%-29s","extra.h radix_sort7_int64");
        lVar5 = local_40 - 1;
        local_78 = 0.0;
        lVar4 = 0;
        do {
          uVar1 = local_38[lVar4];
          fill((int64_t *)ctx,(int)uVar1,type);
          gettimeofday(&local_70,(__timezone_ptr_t)0x0);
          local_48 = (double)local_70.tv_sec;
          local_50 = (double)local_70.tv_usec;
          radix_sort7_int64((int64_t *)ctx,uVar1);
          gettimeofday(&local_70,(__timezone_ptr_t)0x0);
          local_58 = (double)local_70.tv_sec;
          local_60 = (double)local_70.tv_usec;
          iVar2 = verify(ctx,(uchar *)(uVar1 & 0xffffffff),siglen_01,(uchar *)tbs,in_R8);
          if (iVar2 == 0) break;
          local_78 = local_78 +
                     ((local_58 * 1000000.0 + local_60) - (local_48 * 1000000.0 + local_50));
          bVar6 = lVar5 != lVar4;
          lVar4 = lVar4 + 1;
        } while (bVar6);
        pcVar3 = "ok";
        if (iVar2 == 0) {
          pcVar3 = "FAILED";
        }
        printf(" - %s, %10.1f usec\n",local_78,pcVar3);
        fflush((FILE *)0x0);
        if (iVar2 != 0) {
          printf("%-29s","sort.h tim_sort");
          lVar5 = local_40 - 1;
          local_78 = 0.0;
          lVar4 = 0;
          do {
            uVar1 = local_38[lVar4];
            fill((int64_t *)ctx,(int)uVar1,type);
            gettimeofday(&local_70,(__timezone_ptr_t)0x0);
            local_48 = (double)local_70.tv_sec;
            local_50 = (double)local_70.tv_usec;
            sorter_tim_sort((int64_t *)ctx,uVar1);
            gettimeofday(&local_70,(__timezone_ptr_t)0x0);
            local_58 = (double)local_70.tv_sec;
            local_60 = (double)local_70.tv_usec;
            iVar2 = verify(ctx,(uchar *)(uVar1 & 0xffffffff),siglen_02,(uchar *)tbs,in_R8);
            if (iVar2 == 0) break;
            local_78 = local_78 +
                       ((local_58 * 1000000.0 + local_60) - (local_48 * 1000000.0 + local_50));
            bVar6 = lVar5 != lVar4;
            lVar4 = lVar4 + 1;
          } while (bVar6);
          pcVar3 = "ok";
          if (iVar2 == 0) {
            pcVar3 = "FAILED";
          }
          printf(" - %s, %10.1f usec\n",local_78,pcVar3);
          fflush((FILE *)0x0);
          if (iVar2 != 0) {
            printf("%-29s","sort.h quick_sort");
            lVar5 = local_40 - 1;
            local_78 = 0.0;
            lVar4 = 0;
            do {
              uVar1 = local_38[lVar4];
              fill((int64_t *)ctx,(int)uVar1,type);
              gettimeofday(&local_70,(__timezone_ptr_t)0x0);
              local_50 = (double)local_70.tv_usec;
              local_48 = (double)local_70.tv_sec * 1000000.0;
              if (1 < uVar1) {
                sorter_quick_sort_recursive((int64_t *)ctx,0,uVar1 - 1);
              }
              gettimeofday(&local_70,(__timezone_ptr_t)0x0);
              local_60 = (double)local_70.tv_usec;
              local_58 = (double)local_70.tv_sec * 1000000.0;
              iVar2 = verify(ctx,(uchar *)(uVar1 & 0xffffffff),siglen_03,(uchar *)tbs,in_R8);
            } while ((iVar2 != 0) &&
                    (local_78 = local_78 + ((local_58 + local_60) - (local_48 + local_50)),
                    bVar6 = lVar5 != lVar4, lVar4 = lVar4 + 1, bVar6));
            pcVar3 = "ok";
            if (iVar2 == 0) {
              pcVar3 = "FAILED";
            }
            printf(" - %s, %10.1f usec\n",local_78,pcVar3);
            fflush((FILE *)0x0);
            if (iVar2 != 0) {
              printf("%-29s","extra.h std_sort_int64");
              lVar5 = local_40 - 1;
              local_78 = 0.0;
              lVar4 = 0;
              do {
                uVar1 = local_38[lVar4];
                fill((int64_t *)ctx,(int)uVar1,type);
                gettimeofday(&local_70,(__timezone_ptr_t)0x0);
                local_48 = (double)local_70.tv_sec;
                local_50 = (double)local_70.tv_usec;
                std_sort_int64((int64_t *)ctx,uVar1);
                gettimeofday(&local_70,(__timezone_ptr_t)0x0);
                local_58 = (double)local_70.tv_sec;
                local_60 = (double)local_70.tv_usec;
                iVar2 = verify(ctx,(uchar *)(uVar1 & 0xffffffff),siglen_04,(uchar *)tbs,in_R8);
                if (iVar2 == 0) break;
                local_78 = local_78 +
                           ((local_58 * 1000000.0 + local_60) - (local_48 * 1000000.0 + local_50));
                bVar6 = lVar5 != lVar4;
                lVar4 = lVar4 + 1;
              } while (bVar6);
              pcVar3 = "ok";
              if (iVar2 == 0) {
                pcVar3 = "FAILED";
              }
              printf(" - %s, %10.1f usec\n",local_78,pcVar3);
              fflush((FILE *)0x0);
              if (iVar2 != 0) {
                printf("%-29s","extra.h std_stable_int64");
                lVar5 = local_40 - 1;
                local_78 = 0.0;
                lVar4 = 0;
                do {
                  uVar1 = local_38[lVar4];
                  fill((int64_t *)ctx,(int)uVar1,type);
                  gettimeofday(&local_70,(__timezone_ptr_t)0x0);
                  local_48 = (double)local_70.tv_sec;
                  local_50 = (double)local_70.tv_usec;
                  std_stable_int64((int64_t *)ctx,uVar1);
                  gettimeofday(&local_70,(__timezone_ptr_t)0x0);
                  local_58 = (double)local_70.tv_sec;
                  local_60 = (double)local_70.tv_usec;
                  iVar2 = verify(ctx,(uchar *)(uVar1 & 0xffffffff),siglen_05,(uchar *)tbs,in_R8);
                  if (iVar2 == 0) break;
                  local_78 = local_78 +
                             ((local_58 * 1000000.0 + local_60) - (local_48 * 1000000.0 + local_50))
                  ;
                  bVar6 = lVar5 != lVar4;
                  lVar4 = lVar4 + 1;
                } while (bVar6);
                pcVar3 = "ok";
                if (iVar2 == 0) {
                  pcVar3 = "FAILED";
                }
                printf(" - %s, %10.1f usec\n",local_78,pcVar3);
                fflush((FILE *)0x0);
                if (iVar2 != 0) {
                  printf("%-29s","sort.h heap_sort");
                  lVar5 = local_40 - 1;
                  local_78 = 0.0;
                  lVar4 = 0;
                  do {
                    uVar1 = local_38[lVar4];
                    fill((int64_t *)ctx,(int)uVar1,type);
                    gettimeofday(&local_70,(__timezone_ptr_t)0x0);
                    local_48 = (double)local_70.tv_sec;
                    local_50 = (double)local_70.tv_usec;
                    sorter_heap_sort((int64_t *)ctx,uVar1);
                    gettimeofday(&local_70,(__timezone_ptr_t)0x0);
                    local_58 = (double)local_70.tv_sec;
                    local_60 = (double)local_70.tv_usec;
                    iVar2 = verify(ctx,(uchar *)(uVar1 & 0xffffffff),siglen_06,(uchar *)tbs,in_R8);
                    if (iVar2 == 0) break;
                    local_78 = local_78 +
                               ((local_58 * 1000000.0 + local_60) -
                               (local_48 * 1000000.0 + local_50));
                    bVar6 = lVar5 != lVar4;
                    lVar4 = lVar4 + 1;
                  } while (bVar6);
                  pcVar3 = "ok";
                  if (iVar2 == 0) {
                    pcVar3 = "FAILED";
                  }
                  printf(" - %s, %10.1f usec\n",local_78,pcVar3);
                  fflush((FILE *)0x0);
                  if (iVar2 != 0) {
                    printf("%-29s","sort.h merge_sort");
                    lVar5 = local_40 - 1;
                    local_78 = 0.0;
                    lVar4 = 0;
                    do {
                      uVar1 = local_38[lVar4];
                      fill((int64_t *)ctx,(int)uVar1,type);
                      gettimeofday(&local_70,(__timezone_ptr_t)0x0);
                      local_48 = (double)local_70.tv_sec;
                      local_50 = (double)local_70.tv_usec;
                      sorter_merge_sort((int64_t *)ctx,uVar1);
                      gettimeofday(&local_70,(__timezone_ptr_t)0x0);
                      local_58 = (double)local_70.tv_sec;
                      local_60 = (double)local_70.tv_usec;
                      iVar2 = verify(ctx,(uchar *)(uVar1 & 0xffffffff),siglen_07,(uchar *)tbs,in_R8)
                      ;
                      if (iVar2 == 0) break;
                      local_78 = local_78 +
                                 ((local_58 * 1000000.0 + local_60) -
                                 (local_48 * 1000000.0 + local_50));
                      bVar6 = lVar5 != lVar4;
                      lVar4 = lVar4 + 1;
                    } while (bVar6);
                    pcVar3 = "ok";
                    if (iVar2 == 0) {
                      pcVar3 = "FAILED";
                    }
                    printf(" - %s, %10.1f usec\n",local_78,pcVar3);
                    fflush((FILE *)0x0);
                    if (iVar2 != 0) {
                      printf("%-29s","sort.h shell_sort");
                      lVar5 = local_40 - 1;
                      local_78 = 0.0;
                      lVar4 = 0;
                      do {
                        uVar1 = local_38[lVar4];
                        fill((int64_t *)ctx,(int)uVar1,type);
                        gettimeofday(&local_70,(__timezone_ptr_t)0x0);
                        local_48 = (double)local_70.tv_sec;
                        local_50 = (double)local_70.tv_usec;
                        sorter_shell_sort((int64_t *)ctx,uVar1);
                        gettimeofday(&local_70,(__timezone_ptr_t)0x0);
                        local_58 = (double)local_70.tv_sec;
                        local_60 = (double)local_70.tv_usec;
                        iVar2 = verify(ctx,(uchar *)(uVar1 & 0xffffffff),siglen_08,(uchar *)tbs,
                                       in_R8);
                        if (iVar2 == 0) break;
                        local_78 = local_78 +
                                   ((local_58 * 1000000.0 + local_60) -
                                   (local_48 * 1000000.0 + local_50));
                        bVar6 = lVar5 != lVar4;
                        lVar4 = lVar4 + 1;
                      } while (bVar6);
                      pcVar3 = "ok";
                      if (iVar2 == 0) {
                        pcVar3 = "FAILED";
                      }
                      printf(" - %s, %10.1f usec\n",local_78,pcVar3);
                      fflush((FILE *)0x0);
                      if (iVar2 != 0) {
                        printf("%-29s","sort.h merge_sort_in_place");
                        lVar5 = local_40 - 1;
                        local_78 = 0.0;
                        lVar4 = 0;
                        do {
                          uVar1 = local_38[lVar4];
                          fill((int64_t *)ctx,(int)uVar1,type);
                          gettimeofday(&local_70,(__timezone_ptr_t)0x0);
                          local_48 = (double)local_70.tv_sec;
                          local_50 = (double)local_70.tv_usec;
                          sorter_merge_sort_in_place((int64_t *)ctx,uVar1);
                          gettimeofday(&local_70,(__timezone_ptr_t)0x0);
                          local_58 = (double)local_70.tv_sec;
                          local_60 = (double)local_70.tv_usec;
                          iVar2 = verify(ctx,(uchar *)(uVar1 & 0xffffffff),siglen_09,(uchar *)tbs,
                                         in_R8);
                          if (iVar2 == 0) break;
                          local_78 = local_78 +
                                     ((local_58 * 1000000.0 + local_60) -
                                     (local_48 * 1000000.0 + local_50));
                          bVar6 = lVar5 != lVar4;
                          lVar4 = lVar4 + 1;
                        } while (bVar6);
                        pcVar3 = "ok";
                        if (iVar2 == 0) {
                          pcVar3 = "FAILED";
                        }
                        printf(" - %s, %10.1f usec\n",local_78,pcVar3);
                        fflush((FILE *)0x0);
                        if (iVar2 != 0) {
                          printf("%-29s","sort.h grail_sort");
                          lVar5 = local_40 - 1;
                          local_78 = 0.0;
                          lVar4 = 0;
                          do {
                            size = *(uint *)(local_38 + lVar4);
                            fill((int64_t *)ctx,size,type);
                            gettimeofday(&local_70,(__timezone_ptr_t)0x0);
                            local_48 = (double)local_70.tv_sec;
                            local_50 = (double)local_70.tv_usec;
                            tbs_00 = (uchar *)0x0;
                            sorter_grail_common_sort((int64_t *)ctx,size,(int64_t *)0x0,0);
                            gettimeofday(&local_70,(__timezone_ptr_t)0x0);
                            local_58 = (double)local_70.tv_sec;
                            local_60 = (double)local_70.tv_usec;
                            iVar2 = verify(ctx,(uchar *)(ulong)size,siglen_10,tbs_00,in_R8);
                            if (iVar2 == 0) break;
                            local_78 = local_78 +
                                       ((local_58 * 1000000.0 + local_60) -
                                       (local_48 * 1000000.0 + local_50));
                            bVar6 = lVar5 != lVar4;
                            lVar4 = lVar4 + 1;
                          } while (bVar6);
                          pcVar3 = "ok";
                          if (iVar2 == 0) {
                            pcVar3 = "FAILED";
                          }
                          printf(" - %s, %10.1f usec\n",local_78,pcVar3);
                          fflush((FILE *)0x0);
                          if (iVar2 != 0) {
                            printf("%-29s","sort.h sqrt_sort");
                            lVar5 = local_40 - 1;
                            local_78 = 0.0;
                            lVar4 = 0;
                            do {
                              uVar1 = local_38[lVar4];
                              fill((int64_t *)ctx,(int)uVar1,type);
                              gettimeofday(&local_70,(__timezone_ptr_t)0x0);
                              local_48 = (double)local_70.tv_sec;
                              local_50 = (double)local_70.tv_usec;
                              sorter_sqrt_sort((int64_t *)ctx,uVar1);
                              gettimeofday(&local_70,(__timezone_ptr_t)0x0);
                              local_58 = (double)local_70.tv_sec;
                              local_60 = (double)local_70.tv_usec;
                              iVar2 = verify(ctx,(uchar *)(uVar1 & 0xffffffff),siglen_11,tbs_00,
                                             in_R8);
                              if (iVar2 == 0) break;
                              local_78 = local_78 +
                                         ((local_58 * 1000000.0 + local_60) -
                                         (local_48 * 1000000.0 + local_50));
                              bVar6 = lVar5 != lVar4;
                              lVar4 = lVar4 + 1;
                            } while (bVar6);
                            pcVar3 = "ok";
                            if (iVar2 == 0) {
                              pcVar3 = "FAILED";
                            }
                            printf(" - %s, %10.1f usec\n",local_78,pcVar3);
                            fflush((FILE *)0x0);
                            if (iVar2 != 0) {
                              printf("%-29s","stdlib qsort");
                              local_40 = local_40 - 1;
                              local_78 = 0.0;
                              lVar5 = 0;
                              do {
                                uVar1 = local_38[lVar5];
                                fill((int64_t *)ctx,(int)uVar1,type);
                                gettimeofday(&local_70,(__timezone_ptr_t)0x0);
                                local_48 = (double)local_70.tv_sec;
                                local_50 = (double)local_70.tv_usec;
                                tbs_01 = simple_cmp;
                                qsort(ctx,uVar1,8,simple_cmp);
                                gettimeofday(&local_70,(__timezone_ptr_t)0x0);
                                local_58 = (double)local_70.tv_sec;
                                local_60 = (double)local_70.tv_usec;
                                iVar2 = verify(ctx,(uchar *)(uVar1 & 0xffffffff),siglen_12,
                                               (uchar *)tbs_01,in_R8);
                                if (iVar2 == 0) break;
                                local_78 = local_78 +
                                           ((local_58 * 1000000.0 + local_60) -
                                           (local_48 * 1000000.0 + local_50));
                                bVar6 = local_40 != lVar5;
                                lVar5 = lVar5 + 1;
                              } while (bVar6);
                              pcVar3 = "ok";
                              if (iVar2 == 0) {
                                pcVar3 = "FAILED";
                              }
                              printf(" - %s, %10.1f usec\n",local_78,pcVar3);
                              fflush((FILE *)0x0);
                              if (iVar2 != 0) {
                                free(ctx);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int run_tests(int64_t *sizes, int sizes_cnt, int type) {
  int test, res;
  double usec1, usec2, diff;
  int64_t *dst = (int64_t *)malloc(MAXSIZE * sizeof(int64_t));
  printf("-------\nRunning tests with %s:\n", test_names[type]);
  TEST_EXTRA_H(yysort1_int64);
  TEST_EXTRA_H(yysort2_int64);
  // TEST_EXTRA_H(yysort1_int64_sb);
  // TEST_EXTRA_H(yysort2_int64_sb);
  // TEST_EXTRA_H(sort_rela589n_int64);
  TEST_EXTRA_H(radix_sort7_int64);

  TEST_SORT_H(tim_sort);
  TEST_SORT_H(quick_sort);
  TEST_EXTRA_H(std_sort_int64);
  TEST_EXTRA_H(std_stable_int64);
  TEST_SORT_H(heap_sort);
  TEST_SORT_H(merge_sort);
  TEST_SORT_H(shell_sort);
  TEST_SORT_H(merge_sort_in_place);
  TEST_SORT_H(grail_sort);
  TEST_SORT_H(sqrt_sort);
  // TEST_SORT_H(rec_stable_sort);
  // TEST_SORT_H(grail_sort_dyn_buffer);

  TEST_STDLIB(qsort);
#if !defined(__linux__) && !defined(__CYGWIN__)
  TEST_STDLIB(heapsort);
  TEST_STDLIB(mergesort);
#endif

  if (MAXSIZE < 10000) {
    TEST_SORT_H(selection_sort);
    TEST_SORT_H(bubble_sort);
    TEST_SORT_H(binary_insertion_sort);
    TEST_SORT_H(bitonic_sort);
  }
  free(dst);
  return 0;
}